

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::LoadIntegerConstant(VirtualMachine *this)

{
  size_t sVar1;
  element_type *peVar2;
  size_type sVar3;
  const_reference pvVar4;
  allocator<char> local_39;
  string local_38;
  size_t local_18;
  size_t index;
  VirtualMachine *this_local;
  
  index = (size_t)this;
  sVar1 = getByteCodeParameter(this);
  local_18 = sVar1;
  peVar2 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  sVar3 = std::vector<long,_std::allocator<long>_>::size(&peVar2->intConstants);
  if (sVar3 <= sVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Index out of bounds in LoadIntegerConstant",&local_39);
    panic(this,&local_38);
  }
  peVar2 = std::
           __shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->file);
  pvVar4 = std::vector<long,_std::allocator<long>_>::at(&peVar2->intConstants,local_18);
  pushInteger(this,*pvVar4);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::LoadIntegerConstant() {

  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->intConstants.size()) {
    this->panic("Index out of bounds in LoadIntegerConstant");
    return;
  }

  this->pushInteger(this->file->intConstants.at(index));

  this->advance();
}